

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  float fVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar11;
  GLFWwindow *pGVar12;
  long lVar13;
  Vertex *pVVar14;
  uint uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  timespec local_1b88;
  GLFWwindow *local_1b78;
  float local_1b6c;
  int local_1b68;
  int local_1b64;
  thrd_t physics_thread;
  double local_1b58;
  long local_1b50;
  GLfloat mat [16];
  GLfloat local_1b08 [20];
  float local_1ab8 [16];
  Vertex vertex_array [280];
  
  physics_thread = 0;
  iVar10 = glfwInit();
  if (iVar10 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    handle = (GLFWmonitor *)0x0;
    while( true ) {
      while (iVar10 = getopt(argc,argv,"fh"), iVar10 == 0x66) {
        handle = glfwGetPrimaryMonitor();
      }
      if (iVar10 == -1) break;
      if (iVar10 == 0x68) {
        usage();
LAB_00115c14:
        exit(0);
      }
    }
    if (handle == (GLFWmonitor *)0x0) {
      local_1b68 = 0x1e0;
      local_1b64 = 0x280;
    }
    else {
      pGVar11 = glfwGetVideoMode(handle);
      glfwWindowHint(0x21001,pGVar11->redBits);
      glfwWindowHint(0x21002,pGVar11->greenBits);
      glfwWindowHint(0x21003,pGVar11->blueBits);
      glfwWindowHint(0x2100f,pGVar11->refreshRate);
      local_1b64 = pGVar11->width;
      local_1b68 = pGVar11->height;
    }
    pGVar12 = glfwCreateWindow(local_1b64,local_1b68,"Particle Engine",handle,(GLFWwindow *)0x0);
    if (pGVar12 == (GLFWwindow *)0x0) {
      fwrite("Failed to create GLFW window\n",0x1d,1,_stderr);
    }
    else {
      if (handle != (GLFWmonitor *)0x0) {
        glfwSetInputMode(pGVar12,0x33001,0x34003);
      }
      glfwMakeContextCurrent(pGVar12);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      glfwSetFramebufferSizeCallback(pGVar12,resize_callback);
      glfwSetKeyCallback(pGVar12,key_callback);
      local_1b78 = pGVar12;
      glfwGetFramebufferSize(pGVar12,&local_1b64,&local_1b68);
      resize_callback(pGVar12,local_1b64,local_1b68);
      (*glad_glGenTextures)(1,&particle_tex_id);
      (*glad_glBindTexture)(0xde1,particle_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,8,8,0,0x1909,0x1401,"");
      (*glad_glGenTextures)(1,&floor_tex_id);
      (*glad_glBindTexture)(0xde1,floor_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,floor_texture);
      iVar10 = glfwExtensionSupported("GL_EXT_separate_specular_color");
      if (iVar10 != 0) {
        (*glad_glLightModeli)(0x81f8,0x81fa);
      }
      (*glad_glPolygonMode)(0x408,0x1b02);
      wireframe = 0;
      thread_sync.t = 0.0;
      thread_sync.dt = 0.001;
      thread_sync.p_frame = 0;
      thread_sync.d_frame = 0;
      mtx_init(&thread_sync.particles_lock,2);
      cnd_init(&thread_sync.p_done);
      cnd_init(&thread_sync.d_done);
      pGVar12 = local_1b78;
      iVar10 = thrd_create(&physics_thread,physics_thread_main,local_1b78);
      if (iVar10 == 1) {
        glfwSetTime(0.0);
        while( true ) {
          iVar10 = glfwWindowShouldClose(pGVar12);
          if (iVar10 != 0) break;
          dVar4 = glfwGetTime();
          local_1b58 = dVar4 - draw_scene_t_old;
          local_1ab8[0] = 1.5696855 / aspect_ratio;
          local_1ab8[1] = 0.0;
          local_1ab8[2] = 0.0;
          local_1ab8[3] = 0.0;
          local_1ab8[4] = 0.0;
          local_1ab8[5] = 1.5696855;
          local_1ab8[6] = 0.0;
          local_1ab8[7] = 0.0;
          local_1ab8[8] = 0.0;
          local_1ab8[9] = 0.0;
          local_1ab8[10] = -1.0338984;
          local_1ab8[0xb] = -1.0;
          local_1ab8[0xc] = 0.0;
          local_1ab8[0xd] = 0.0;
          local_1ab8[0xe] = -2.0338984;
          local_1ab8[0xf] = 0.0;
          draw_scene_t_old = dVar4;
          (*glad_glClearColor)(0.1,0.1,0.1,1.0);
          (*glad_glClear)(0x4100);
          (*glad_glMatrixMode)(0x1701);
          (*glad_glLoadMatrixf)(local_1ab8);
          (*glad_glMatrixMode)(0x1700);
          (*glad_glLoadIdentity)();
          dVar5 = sin(dVar4 * 0.3);
          (*glad_glRotated)(-80.0,1.0,0.0,0.0);
          (*glad_glRotated)(dVar5 * -10.0,0.0,1.0,0.0);
          (*glad_glRotated)(-(dVar4 * 10.0),0.0,0.0,1.0);
          dVar5 = dVar4 * 10.0 * 0.017453292519943295;
          dVar6 = sin(dVar5);
          dVar7 = sin(dVar4 * 0.054105206811824215);
          dVar5 = cos(dVar5);
          dVar8 = cos(dVar4 * 0.05061454830783556);
          dVar9 = cos(dVar4 * 0.08552113334772216);
          (*glad_glTranslated)
                    (-(dVar7 + dVar7 + dVar6 * 15.0),-(dVar5 * -15.0 + dVar8 + dVar8),
                     -(dVar9 + dVar9 + 4.0));
          (*glad_glFrontFace)(0x901);
          (*glad_glCullFace)(0x405);
          (*glad_glEnable)(0xb44);
          vertex_array[0].s = 0.0;
          vertex_array[0].t = -9.0;
          vertex_array[0].rgba = 0x41000000;
          vertex_array[0].x = 1.0;
          mat[0] = 0.2;
          mat[1] = 0.2;
          mat[2] = 0.2;
          mat[3] = 1.0;
          local_1b88.tv_sec = 0x3ecccccd3f4ccccd;
          local_1b88.tv_nsec = 0x3f8000003e4ccccd;
          local_1b08[0x10] = 1.0;
          local_1b08[0x11] = 0.6;
          local_1b08[0x12] = 0.2;
          local_1b08[0x13] = 0.0;
          local_1b08[0xc] = -15.0;
          local_1b08[0xd] = 12.0;
          local_1b08[0xe] = 1.5;
          local_1b08[0xf] = 1.0;
          local_1b08[8] = 0.0;
          local_1b08[9] = 0.0;
          local_1b08[10] = 0.0;
          local_1b08[0xb] = 1.0;
          local_1b08[4] = 0.2;
          local_1b08[5] = 0.4;
          local_1b08[6] = 0.8;
          local_1b08[7] = 1.0;
          local_1b08[0] = 0.2;
          local_1b08[1] = 0.6;
          local_1b08[2] = 1.0;
          local_1b08[3] = 0.0;
          (*glad_glLightfv)(0x4001,0x1203,&vertex_array[0].s);
          (*glad_glLightfv)(0x4001,0x1200,mat);
          (*glad_glLightfv)(0x4001,0x1201,(GLfloat *)&local_1b88);
          (*glad_glLightfv)(0x4001,0x1202,local_1b08 + 0x10);
          (*glad_glLightfv)(0x4002,0x1203,local_1b08 + 0xc);
          (*glad_glLightfv)(0x4002,0x1200,local_1b08 + 8);
          (*glad_glLightfv)(0x4002,0x1201,local_1b08 + 4);
          (*glad_glLightfv)(0x4002,0x1202,local_1b08);
          (*glad_glLightfv)(0x4003,0x1203,glow_pos);
          (*glad_glLightfv)(0x4003,0x1201,glow_color);
          (*glad_glLightfv)(0x4003,0x1202,glow_color);
          (*glad_glEnable)(0x4001);
          (*glad_glEnable)(0x4002);
          (*glad_glEnable)(0x4003);
          (*glad_glEnable)(0xb50);
          (*glad_glEnable)(0xb60);
          (*glad_glFogi)(0xb65,0x800);
          (*glad_glFogf)(0xb62,0.05);
          (*glad_glFogfv)(0xb66,fog_color);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,floor_tex_id);
          }
          if (draw_floor_floor_list == 0) {
            draw_floor_floor_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_floor_floor_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,floor_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,floor_specular);
            (*glad_glMaterialf)(0x404,0x1601,18.0);
            (*glad_glNormal3f)(0.0,0.0,1.0);
            (*glad_glBegin)(7);
            tessellate_floor(-1.0,-1.0,0.0,0.0,0);
            tessellate_floor(0.0,-1.0,1.0,0.0,0);
            tessellate_floor(0.0,0.0,1.0,1.0,0);
            tessellate_floor(-1.0,0.0,0.0,1.0,0);
            (*glad_glEnd)();
            (*glad_glEndList)();
          }
          else {
            (*glad_glCallList)(draw_floor_floor_list);
          }
          (*glad_glDisable)(0xde1);
          (*glad_glEnable)(0xb71);
          (*glad_glDepthFunc)(0x203);
          (*glad_glDepthMask)('\x01');
          if (draw_fountain_fountain_list == 0) {
            draw_fountain_fountain_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_fountain_fountain_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,fountain_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,fountain_specular);
            (*glad_glMaterialf)(0x404,0x1601,12.0);
            lVar13 = 0;
            while (lVar13 != 0xd) {
              (*glad_glBegin)(5);
              fVar20 = fountain_normal[lVar13 * 2 + 2];
              local_1b6c = fountain_normal[lVar13 * 2 + 3];
              lVar1 = lVar13 * 2 + 1;
              dVar5 = 0.0;
              iVar10 = 0x21;
              local_1b50 = lVar13;
              while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
                dVar6 = cos(dVar5 * 0.19634954084936207);
                fVar22 = (float)dVar6;
                dVar6 = sin(dVar5 * 0.19634954084936207);
                fVar23 = (float)dVar6;
                (*glad_glNormal3f)(fVar20 * fVar22,fVar20 * fVar23,local_1b6c);
                fVar21 = fountain_side[lVar13 * 2];
                (*glad_glVertex3f)(fountain_side[lVar13 * 2 + 2] * fVar22,
                                   fountain_side[lVar13 * 2 + 2] * fVar23,
                                   fountain_side[lVar13 * 2 + 3]);
                (*glad_glNormal3f)(fountain_normal[lVar13 * 2] * fVar22,
                                   fountain_normal[lVar13 * 2] * fVar23,fountain_normal[lVar1]);
                (*glad_glVertex3f)(fVar22 * fVar21,fVar21 * fVar23,fountain_side[lVar1]);
                dVar5 = dVar5 + 1.0;
              }
              (*glad_glEnd)();
              lVar13 = local_1b50 + 1;
            }
            (*glad_glEndList)();
            pGVar12 = local_1b78;
          }
          else {
            (*glad_glCallList)(draw_fountain_fountain_list);
          }
          (*glad_glDisable)(0xb50);
          (*glad_glDisable)(0xb60);
          (*glad_glGetFloatv)(0xba6,mat);
          fVar20 = (mat[0] + mat[1]) * -0.35;
          fVar21 = (mat[4] + mat[5]) * -0.35;
          fVar25 = (mat[8] + mat[9]) * -0.35;
          fVar22 = (mat[0] - mat[1]) * 0.35;
          fVar23 = (mat[4] - mat[5]) * 0.35;
          fVar24 = (mat[8] - mat[9]) * 0.35;
          (*glad_glDepthMask)('\0');
          (*glad_glEnable)(0xbe2);
          (*glad_glBlendFunc)(0x302,1);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,particle_tex_id);
          }
          fVar17 = (float)local_1b58;
          (*glad_glInterleavedArrays)(0x2a29,0,vertex_array);
          mtx_lock(&thread_sync.particles_lock);
          while( true ) {
            iVar10 = glfwWindowShouldClose(pGVar12);
            if ((iVar10 != 0) || (thread_sync.d_frame < thread_sync.p_frame)) break;
            clock_gettime(0,&local_1b88);
            lVar13 = local_1b88.tv_nsec + 100000000;
            local_1b88.tv_nsec = lVar13 % 1000000000;
            local_1b88.tv_sec = local_1b88.tv_sec + lVar13 / 1000000000;
            cnd_timedwait(&thread_sync.p_done,&thread_sync.particles_lock,(timespec *)&local_1b88);
          }
          thread_sync.dt = fVar17;
          thread_sync.d_frame = thread_sync.d_frame + 1;
          iVar10 = 0;
          pVVar14 = vertex_array;
          thread_sync.t = dVar4;
          for (lVar13 = 0x28; (int)lVar13 != 0x203c8; lVar13 = lVar13 + 0x2c) {
            if (*(int *)((long)&particles[0].x + lVar13) != 0) {
              fVar18 = *(float *)(lVar13 + 0x15438c) * 4.0;
              fVar17 = 1.0;
              if (fVar18 <= 1.0) {
                fVar17 = fVar18;
              }
              fVar18 = *(float *)((long)&aspect_ratio + lVar13);
              fVar19 = *(float *)(lVar13 + 0x154384);
              fVar2 = *(float *)(lVar13 + 0x154388);
              pVVar14->s = 0.0;
              pVVar14->t = 0.0;
              uVar15 = (int)(fVar18 * 255.0) & 0xffU |
                       ((int)(fVar19 * 255.0) & 0xffU) << 8 |
                       ((int)(fVar2 * 255.0) & 0xffU) << 0x10 | (int)(fVar17 * 255.0) << 0x18;
              pVVar14->rgba = uVar15;
              uVar3 = *(undefined8 *)((long)&thread_sync.particles_lock + lVar13 + 0x10);
              fVar18 = (float)uVar3;
              fVar19 = (float)((ulong)uVar3 >> 0x20);
              pVVar14->x = fVar20 + fVar18;
              pVVar14->y = fVar21 + fVar19;
              fVar17 = *(float *)((long)&thread_sync.particles_lock + lVar13 + 0x18);
              pVVar14->z = fVar25 + fVar17;
              pVVar14[1].s = 1.0;
              pVVar14[1].t = 0.0;
              pVVar14[1].rgba = uVar15;
              pVVar14[1].x = fVar22 + fVar18;
              pVVar14[1].y = fVar23 + fVar19;
              pVVar14[1].z = fVar24 + fVar17;
              pVVar14[2].s = 1.0;
              pVVar14[2].t = 1.0;
              pVVar14[2].rgba = uVar15;
              pVVar14[2].x = fVar18 - fVar20;
              pVVar14[2].y = fVar19 - fVar21;
              pVVar14[2].z = fVar17 - fVar25;
              pVVar14[3].s = 0.0;
              pVVar14[3].t = 1.0;
              pVVar14[3].rgba = uVar15;
              pVVar14[3].x = fVar18 - fVar22;
              pVVar14[3].y = fVar19 - fVar23;
              pVVar14[3].z = fVar17 - fVar24;
              if (iVar10 < 0x45) {
                pVVar14 = pVVar14 + 4;
                iVar10 = iVar10 + 1;
              }
              else {
                (*glad_glDrawArrays)(7,0,(iVar10 + 1) * 4);
                iVar10 = 0;
                pVVar14 = vertex_array;
              }
            }
          }
          mtx_unlock(&thread_sync.particles_lock);
          cnd_signal(&thread_sync.d_done);
          (*glad_glDrawArrays)(7,0,iVar10 << 2);
          (*glad_glDisableClientState)(0x8074);
          (*glad_glDisableClientState)(0x8078);
          (*glad_glDisableClientState)(0x8076);
          (*glad_glDisable)(0xde1);
          (*glad_glDisable)(0xbe2);
          (*glad_glDepthMask)('\x01');
          (*glad_glDisable)(0xb71);
          pGVar12 = local_1b78;
          glfwSwapBuffers(local_1b78);
          glfwPollEvents();
        }
        thrd_join(physics_thread,(int *)0x0);
        glfwDestroyWindow(pGVar12);
        glfwTerminate();
        goto LAB_00115c14;
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    thrd_t physics_thread = 0;
    GLFWwindow* window;
    GLFWmonitor* monitor = NULL;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width  = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Particle Engine", monitor, NULL);
    if (!window)
    {
        fprintf(stderr, "Failed to create GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    if (monitor)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetFramebufferSizeCallback(window, resize_callback);
    glfwSetKeyCallback(window, key_callback);

    // Set initial aspect ratio
    glfwGetFramebufferSize(window, &width, &height);
    resize_callback(window, width, height);

    // Upload particle texture
    glGenTextures(1, &particle_tex_id);
    glBindTexture(GL_TEXTURE_2D, particle_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, P_TEX_WIDTH, P_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, particle_texture);

    // Upload floor texture
    glGenTextures(1, &floor_tex_id);
    glBindTexture(GL_TEXTURE_2D, floor_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, F_TEX_WIDTH, F_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, floor_texture);

    if (glfwExtensionSupported("GL_EXT_separate_specular_color"))
    {
        glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL_EXT,
                      GL_SEPARATE_SPECULAR_COLOR_EXT);
    }

    // Set filled polygon mode as default (not wireframe)
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    wireframe = 0;

    // Set initial times
    thread_sync.t  = 0.0;
    thread_sync.dt = 0.001f;
    thread_sync.p_frame = 0;
    thread_sync.d_frame = 0;

    mtx_init(&thread_sync.particles_lock, mtx_timed);
    cnd_init(&thread_sync.p_done);
    cnd_init(&thread_sync.d_done);

    if (thrd_create(&physics_thread, physics_thread_main, window) != thrd_success)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetTime(0.0);

    while (!glfwWindowShouldClose(window))
    {
        draw_scene(window, glfwGetTime());

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    thrd_join(physics_thread, NULL);

    glfwDestroyWindow(window);
    glfwTerminate();

    exit(EXIT_SUCCESS);
}